

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

Polynom<Complex> __thiscall Polynom<Complex>::operator*(Polynom<Complex> *this,Polynom<Complex> *a)

{
  int iVar1;
  uint uVar2;
  long in_RDX;
  Complex *extraout_RDX;
  int iVar3;
  uint uVar4;
  Polynom<Complex> PVar5;
  uint local_cc;
  Complex local_b0;
  
  Polynom(this,((a->m).N + *(int *)(in_RDX + 4)) - 1);
  if ((a->m).N != 0) {
    iVar1 = 0;
    local_cc = 0;
    do {
      uVar2 = *(uint *)(in_RDX + 4);
      if (uVar2 != 0) {
        uVar4 = 0;
        iVar3 = -1;
        do {
          ::operator*(&local_b0,(a->m).arr + ((a->m).N + ~local_cc),
                      (Complex *)((ulong)(uVar2 + iVar3) * 0x80 + *(long *)(in_RDX + 8)));
          Complex::operator+=((this->m).arr + (iVar1 + iVar3 + (this->m).N),&local_b0);
          if (local_b0._im._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0._im._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_b0._im._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0._im._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_b0._re._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0._re._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_b0._re._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0._re._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + 1;
          uVar2 = *(uint *)(in_RDX + 4);
          iVar3 = iVar3 + -1;
        } while (uVar4 < uVar2);
      }
      local_cc = local_cc + 1;
      iVar1 = iVar1 + -1;
    } while (local_cc < (a->m).N);
  }
  strip(this);
  PVar5.m.arr = extraout_RDX;
  PVar5.m._0_8_ = this;
  return (Polynom<Complex>)PVar5.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}